

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArenaTest.cpp
# Opt level: O2

void __thiscall Arena_ConExcep_Test::TestBody(Arena_ConExcep_Test *this)

{
  bool bVar1;
  void *pvVar2;
  long lVar3;
  ostream *poVar4;
  undefined8 *puVar5;
  pointer *__ptr;
  long lVar6;
  AssertionResult gtest_ar;
  char *local_88;
  undefined8 local_80;
  char local_78 [24];
  AssertionResult gtest_ar_;
  Arena arena;
  
  memt::Arena::Arena(&arena);
  local_88 = local_78;
  local_78[0] = '\0';
  local_78[1] = '\0';
  local_78[2] = '\0';
  local_78[3] = '\0';
  local_78[4] = '\0';
  local_78[5] = '\0';
  local_78[6] = '\0';
  local_78[7] = '\0';
  local_78[8] = '\0';
  local_78[9] = '\0';
  local_78[10] = '\0';
  local_78[0xb] = '\0';
  local_78[0xc] = '\0';
  local_78[0xd] = '\0';
  local_78[0xe] = '\0';
  local_78[0xf] = '\0';
  local_80 = 0;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    pvVar2 = memt::Arena::alloc(&arena,0x50);
    for (lVar6 = 0; lVar6 != 0x50; lVar6 = lVar6 + 8) {
      lVar3 = (anonymous_namespace)::
              _frobby_Helper<(anonymous_namespace)::_frobby_ConExcepHelperTag,4ul>::_count + 1;
      (anonymous_namespace)::_frobby_Helper<(anonymous_namespace)::_frobby_ConExcepHelperTag,4ul>::
      _count = lVar3;
      *(long *)((long)pvVar2 + lVar6) = lVar3;
      if (lVar3 == 4) {
        poVar4 = std::operator<<((ostream *)
                                 &(anonymous_namespace)::
                                  _frobby_Helper<(anonymous_namespace)::_frobby_ConExcepHelperTag,4ul>
                                  ::_log_abi_cxx11_,'T');
        std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        puVar5 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar5 = *(undefined8 *)((long)pvVar2 + lVar6);
        __cxa_throw(puVar5,&unsigned_long::typeinfo,0);
      }
      poVar4 = std::operator<<((ostream *)
                               &(anonymous_namespace)::
                                _frobby_Helper<(anonymous_namespace)::_frobby_ConExcepHelperTag,4ul>
                                ::_log_abi_cxx11_,'+');
      std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    }
  }
  std::__cxx11::string::assign((char *)&local_88);
  testing::Message::Message((Message *)&gtest_ar_);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_ar,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Macaulay2[P]memtailor/src/test/ArenaTest.cpp"
             ,0xb2,local_88);
  testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&gtest_ar_);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
  if (gtest_ar_._0_8_ != 0) {
    (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
  }
  std::__cxx11::string::~string((string *)&local_88);
  memt::Arena::~Arena(&arena);
  return;
}

Assistant:

TEST(Arena, ConExcep) {
  memt::Arena arena;
  ASSERT_THROW(arena.allocArray<ConExcepHelper>(10), size_t);
  ASSERT_EQ(ConExcepHelper::resetLog(), "+1+2+3T4-3-2-1");
  ASSERT_TRUE(arena.isEmpty());
}